

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O0

void PHYSFS_utf8ToUcs2(char *src,PHYSFS_uint16 *dst,PHYSFS_uint64 len)

{
  uint local_24;
  ulong uStack_20;
  PHYSFS_uint32 cp;
  PHYSFS_uint64 len_local;
  PHYSFS_uint16 *dst_local;
  char *src_local;
  
  uStack_20 = len - 2;
  len_local = (PHYSFS_uint64)dst;
  dst_local = (PHYSFS_uint16 *)src;
  while ((1 < uStack_20 && (local_24 = __PHYSFS_utf8codepoint((char **)&dst_local), local_24 != 0)))
  {
    if (local_24 == 0xffffffff) {
      local_24 = 0x3f;
    }
    if (0xffff < local_24) {
      local_24 = 0x3f;
    }
    *(short *)len_local = (short)local_24;
    uStack_20 = uStack_20 - 2;
    len_local = len_local + 2;
  }
  *(undefined2 *)len_local = 0;
  return;
}

Assistant:

void PHYSFS_utf8ToUcs2(const char *src, PHYSFS_uint16 *dst, PHYSFS_uint64 len)
{
    len -= sizeof (PHYSFS_uint16);   /* save room for null char. */
    while (len >= sizeof (PHYSFS_uint16))
    {
        PHYSFS_uint32 cp = __PHYSFS_utf8codepoint(&src);
        if (cp == 0)
            break;
        else if (cp == UNICODE_BOGUS_CHAR_VALUE)
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;

        if (cp > 0xFFFF)  /* UTF-16 surrogates (bogus chars in UCS-2) */
            cp = UNICODE_BOGUS_CHAR_CODEPOINT;

        *(dst++) = cp;
        len -= sizeof (PHYSFS_uint16);
    } /* while */

    *dst = 0;
}